

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_DoublingFactorCounterTest_AllSimples_Test::~TEST_DoublingFactorCounterTest_AllSimples_Test
          (TEST_DoublingFactorCounterTest_AllSimples_Test *this)

{
  TEST_DoublingFactorCounterTest_AllSimples_Test *mem;
  TEST_DoublingFactorCounterTest_AllSimples_Test *this_local;
  
  mem = this;
  ~TEST_DoublingFactorCounterTest_AllSimples_Test(this);
  operator_delete(mem,(size_t)this);
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, AllSimples)
{
	addPair(Tile::ThreeOfCharacters);
	addSequence(Tile::FiveOfCharacters, false);
	addTriplet(Tile::ThreeOfCircles, false);
	addSequence(Tile::ThreeOfBamboos, false);
	addSequence(Tile::SixOfBamboos, false);

	s.winByDiscard();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::AllSimples));
	CHECK_EQUAL(1, r.doubling_factor);
}